

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<float>_>::MultiplyByScalar
          (TPZMatrix<Fad<float>_> *this,Fad<float> *alpha,TPZMatrix<Fad<float>_> *res)

{
  Fad<float> FStack_c8;
  TPZFMatrixRef<Fad<float>_> local_a8;
  
  (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
  Fad<float>::Fad(&FStack_c8,alpha);
  Storage(&local_a8,res);
  TPZFMatrix<Fad<float>_>::operator*=(&local_a8.super_TPZFMatrix<Fad<float>_>,&FStack_c8);
  TPZFMatrixRef<Fad<float>_>::~TPZFMatrixRef(&local_a8);
  Fad<float>::~Fad(&FStack_c8);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}